

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

bool __thiscall
r_comp::Class::get_member_index
          (Class *this,Metadata *metadata,string *name,uint16_t *index,Class **p)

{
  pointer pSVar1;
  __type _Var2;
  bool bVar3;
  ulong uVar4;
  Class *pCVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  do {
    uVar7 = uVar6 & 0xffff;
    pSVar1 = (this->things_to_read).
             super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->things_to_read).
                   super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x60;
    if (uVar4 <= uVar7) {
LAB_0012baa2:
      return uVar7 < uVar4;
    }
    _Var2 = std::operator==(&pSVar1[uVar7].name,name);
    if (_Var2) {
      bVar3 = has_offset(this);
      *index = (ushort)bVar3 + (short)uVar6;
      bVar3 = StructureMember::used_as_expression
                        ((this->things_to_read).
                         super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar7);
      if (bVar3) {
        pCVar5 = (Class *)0x0;
      }
      else {
        pCVar5 = StructureMember::get_class
                           ((this->things_to_read).
                            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar7,metadata);
      }
      *p = pCVar5;
      goto LAB_0012baa2;
    }
    uVar6 = (ulong)((int)uVar7 + 1);
  } while( true );
}

Assistant:

bool Class::get_member_index(Metadata *metadata, std::string &name, uint16_t &index, Class *&p) const
{
    for (uint16_t i = 0; i < things_to_read.size(); ++i)
        if (things_to_read[i].name == name) {
            index = (has_offset() ? i + 1 : i); // in expressions the lead r-atom is at 0; in objects, members start at 1

            if (things_to_read[i].used_as_expression()) { // the class is: [::a-class]
                p = nullptr;
            } else {
                p = things_to_read[i].get_class(metadata);
            }

            return true;
        }

    return false;
}